

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void skip_utf8_bom_should_skip_bom(void)

{
  long lVar1;
  parse_buffer *ppVar2;
  long in_FS_OFFSET;
  undefined1 local_50 [8];
  parse_buffer buffer;
  uchar string [6];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  buffer.hooks.reallocate._2_4_ = 0x7bbfbbef;
  buffer.hooks.reallocate._6_2_ = 0x7d;
  memset(local_50,0,0x38);
  local_50 = (undefined1  [8])((long)&buffer.hooks.reallocate + 2);
  buffer.content = (uchar *)0x6;
  buffer.depth = (size_t)global_hooks.allocate;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  ppVar2 = skip_utf8_bom((parse_buffer *)local_50);
  if (ppVar2 != (parse_buffer *)local_50) {
    UnityFail(" Expected TRUE Was FALSE",0x1ce);
  }
  UnityAssertEqualNumber(3,(ulong)(uint)buffer.length,(char *)0x0,0x1cf,UNITY_DISPLAY_STYLE_UINT);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void skip_utf8_bom_should_skip_bom(void)
{
    const unsigned char string[] = "\xEF\xBB\xBF{}";
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = string;
    buffer.length = sizeof(string);
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE(skip_utf8_bom(&buffer) == &buffer);
    TEST_ASSERT_EQUAL_UINT(3U, (unsigned int)buffer.offset);
}